

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O3

void __thiscall cmCTestLaunch::WriteXMLResult(cmCTestLaunch *this,cmXMLElement *e2)

{
  cmsysProcess *cp;
  cmXMLElement cVar1;
  int iVar2;
  cmXMLElement e4;
  cmXMLElement e3;
  cmXMLElement local_30;
  cmXMLElement local_28;
  char *local_20;
  
  cmXMLWriter::Comment(e2->xmlwr,"Result of command");
  cmXMLElement::cmXMLElement(&local_28,e2,"Result");
  DumpFileToXML(this,&local_28,"StdOut",&this->LogOut);
  DumpFileToXML(this,&local_28,"StdErr",&this->LogErr);
  cmXMLElement::cmXMLElement(&local_30,&local_28,"ExitCondition");
  cp = this->Process;
  iVar2 = cmsysProcess_GetState(cp);
  cVar1.xmlwr = local_30.xmlwr;
  switch(iVar2) {
  case 0:
    cmXMLWriter::Content<char[29]>(local_30.xmlwr,(char (*) [29])"No process has been executed");
    break;
  case 1:
    cmXMLWriter::Content<char[37]>
              (local_30.xmlwr,(char (*) [37])"Error administrating child process: ");
    local_20 = cmsysProcess_GetErrorString(cp);
    cmXMLWriter::Content<char_const*>(local_30.xmlwr,&local_20);
    break;
  case 2:
    cmXMLWriter::Content<char[24]>(local_30.xmlwr,(char (*) [24])"Terminated abnormally: ");
    local_20 = cmsysProcess_GetExceptionString(cp);
    cmXMLWriter::Content<char_const*>(local_30.xmlwr,&local_20);
    break;
  case 3:
    cmXMLWriter::Content<char[31]>(local_30.xmlwr,(char (*) [31])"The process is still executing");
    break;
  case 4:
    cmXMLWriter::PreContent(local_30.xmlwr);
    std::ostream::operator<<((cVar1.xmlwr)->Output,this->ExitCode);
    break;
  case 5:
    cmXMLWriter::Content<char[28]>(local_30.xmlwr,(char (*) [28])"Killed when timeout expired");
    break;
  case 6:
    cmXMLWriter::Content<char[17]>(local_30.xmlwr,(char (*) [17])"Killed by parent");
    break;
  case 7:
    cmXMLWriter::Content<char[9]>(local_30.xmlwr,(char (*) [9])"Disowned");
  }
  cmXMLWriter::EndElement(local_30.xmlwr);
  cmXMLWriter::EndElement(local_28.xmlwr);
  return;
}

Assistant:

void cmCTestLaunch::WriteXMLResult(cmXMLElement& e2)
{
  e2.Comment("Result of command");
  cmXMLElement e3(e2, "Result");

  // StdOut
  this->DumpFileToXML(e3, "StdOut", this->LogOut);

  // StdErr
  this->DumpFileToXML(e3, "StdErr", this->LogErr);

  // ExitCondition
  cmXMLElement e4(e3, "ExitCondition");
  cmsysProcess* cp = this->Process;
  switch (cmsysProcess_GetState(cp)) {
    case cmsysProcess_State_Starting:
      e4.Content("No process has been executed");
      break;
    case cmsysProcess_State_Executing:
      e4.Content("The process is still executing");
      break;
    case cmsysProcess_State_Disowned:
      e4.Content("Disowned");
      break;
    case cmsysProcess_State_Killed:
      e4.Content("Killed by parent");
      break;

    case cmsysProcess_State_Expired:
      e4.Content("Killed when timeout expired");
      break;
    case cmsysProcess_State_Exited:
      e4.Content(this->ExitCode);
      break;
    case cmsysProcess_State_Exception:
      e4.Content("Terminated abnormally: ");
      e4.Content(cmsysProcess_GetExceptionString(cp));
      break;
    case cmsysProcess_State_Error:
      e4.Content("Error administrating child process: ");
      e4.Content(cmsysProcess_GetErrorString(cp));
      break;
  }
}